

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::eval_rightShiftVecScalar_ivec2(ShaderEvalContext *c)

{
  int iVar1;
  VecAccess<float,_4,_2> local_50;
  Vector<float,_2> local_40;
  Vector<int,_2> local_38;
  Vector<int,_2> local_30;
  Vector<float,_2> local_28;
  
  local_40.m_data[1] = c->in[0].m_data[1];
  local_40.m_data[0] = c->in[0].m_data[3];
  tcu::Vector<float,_2>::cast<int>(&local_40);
  iVar1 = (int)c->in[1].m_data[0];
  local_50.m_vector = (Vector<float,_4> *)CONCAT44(iVar1,iVar1);
  sr::(anonymous_namespace)::rightShift<int,2>(&local_38,(Vector<int,_2> *)&local_50);
  tcu::Vector<int,_2>::cast<float>(&local_30);
  local_50.m_vector = &c->color;
  local_50.m_index[0] = 1;
  local_50.m_index[1] = 2;
  tcu::VecAccess<float,_4,_2>::operator=(&local_50,&local_28);
  return;
}

Assistant:

void eval_selection_ivec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(1, 0).asInt(),			c.in[2].swizzle(2, 1).asInt()).asFloat(); }